

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.cpp
# Opt level: O2

void __thiscall phaeton::Stmt::dump(Stmt *this,uint Indent)

{
  long lVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  uint uVar4;
  string Str;
  stringstream StrStream;
  string asStack_1e8 [8];
  int local_1e0;
  string local_1c8 [32];
  ASTNodeKind local_1a8 [4];
  ostream local_198 [376];
  
  local_1a8[0] = (this->super_ASTNode).NodeKind;
  pmVar2 = std::
           map<phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<phaeton::ASTNode::ASTNodeKind>,_std::allocator<std::pair<const_phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&ASTNode::NodeLabel_abi_cxx11_,local_1a8);
  std::__cxx11::string::string(asStack_1e8,(string *)pmVar2);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  poVar3 = std::operator<<(local_198," <");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3,">");
  lVar1 = std::cout;
  *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       (ulong)Indent;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::operator<<((ostream *)&std::cout,"");
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f;
  poVar3 = std::operator<<((ostream *)&std::cout,"(");
  poVar3 = std::operator<<(poVar3,asStack_1e8);
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,local_1c8);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_1c8);
  uVar4 = Indent + 1;
  Identifier::dump(this->Id,local_1e0 + uVar4);
  (*(this->RightExpr->super_ASTNode)._vptr_ASTNode[1])(this->RightExpr,(ulong)(local_1e0 + uVar4));
  lVar1 = std::cout;
  *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       (ulong)uVar4;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::operator<<((ostream *)&std::cout,"");
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f;
  std::operator<<((ostream *)&std::cout,")\n");
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::__cxx11::string::~string(asStack_1e8);
  return;
}

Assistant:

void Stmt::dump(unsigned Indent) const {
  std::string Str = NodeLabel[getASTNodeKind()];

  std::stringstream StrStream;
  StrStream << " <" << std::hex << this << ">";

  FORMAT_AST_INDENT(Indent)
  std::cout << "(" << Str << StrStream.str() << "\n";
  Id->dump(Indent + Str.length() + 1);
  RightExpr->dump(Indent + Str.length() + 1);
  FORMAT_AST_INDENT(Indent + 1)
  std::cout << ")\n";
}